

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::tuple<int,int>,std::tuple<int,int>>
          (String *__return_storage_ptr__,detail *this,tuple<int,_int> *lhs,char *op,
          tuple<int,_int> *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = tlssPush();
  test_detail::print_tuple_impl<std::tuple<int,int>,0ul,1ul>(poVar1,this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  poVar1 = tlssPush();
  test_detail::print_tuple_impl<std::tuple<int,int>,0ul,1ul>(poVar1,op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }